

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powell.hpp
# Opt level: O1

double optimize(double initial,function<double_(double)> *loss)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  double local_28;
  double local_18;
  
  local_60 = initial;
  local_28 = initial;
  if ((loss->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_50 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
    local_60 = local_28 + -1.0;
    uStack_30 = 0;
    local_38 = local_60;
    if ((loss->super__Function_base)._M_manager != (_Manager_type)0x0) {
      local_48 = local_28 + 1.0;
      local_38 = local_60;
      local_58 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
      local_60 = local_48;
      if ((loss->super__Function_base)._M_manager != (_Manager_type)0x0) {
        local_40 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
        if (local_58 <= local_50) {
          local_58 = 1.0;
          do {
            local_60 = local_38 - local_58;
            local_38 = local_60;
            if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00157767;
            local_38 = local_60;
            dVar1 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
            local_58 = local_58 + local_58;
          } while (dVar1 <= local_50);
        }
        if (local_40 <= local_50) {
          local_58 = 1.0;
          do {
            local_60 = local_48 + local_58;
            local_48 = local_60;
            if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00157767;
            dVar1 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
            local_58 = local_58 + local_58;
          } while (dVar1 <= local_50);
        }
        dVar1 = (local_48 - local_38) * 0.6180339887498949;
        local_60 = local_48 - dVar1;
        local_58 = local_60;
        if ((loss->super__Function_base)._M_manager != (_Manager_type)0x0) {
          local_50 = dVar1 + local_38;
          local_58 = local_60;
          local_40 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
          local_60 = local_50;
          if ((loss->super__Function_base)._M_manager != (_Manager_type)0x0) {
            dVar2 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
            dVar1 = local_38;
            uVar4 = uStack_30;
            if (1e-05 < ABS(local_58 - local_50)) {
              dVar3 = local_50;
              dVar5 = local_58;
              dVar6 = local_40;
              do {
                local_58 = dVar5;
                local_50 = dVar3;
                if (dVar2 <= dVar6) {
                  local_60 = (local_48 - dVar3) * -0.6180339887498949 + local_48;
                  local_40 = local_60;
                  local_38 = dVar2;
                  if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_00157767;
                  dVar2 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
                  uVar4 = 0;
                  dVar1 = local_58;
                  dVar3 = local_40;
                  dVar5 = local_50;
                }
                else {
                  local_60 = (dVar5 - dVar1) * 0.6180339887498949 + dVar1;
                  local_40 = dVar6;
                  local_38 = dVar1;
                  uStack_30 = uVar4;
                  local_18 = local_60;
                  if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0)
                  goto LAB_00157767;
                  dVar2 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
                  local_48 = local_50;
                  dVar1 = local_38;
                  uVar4 = uStack_30;
                  dVar3 = local_58;
                  local_38 = dVar2;
                  dVar5 = local_18;
                  dVar2 = local_40;
                }
                dVar6 = local_38;
              } while (1e-05 < ABS(dVar5 - dVar3));
            }
            local_60 = (dVar1 + local_48) * 0.5;
            local_38 = local_60;
            uStack_30 = uVar4;
            if ((loss->super__Function_base)._M_manager != (_Manager_type)0x0) {
              local_38 = local_60;
              local_48 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
              local_60 = local_28;
              if ((loss->super__Function_base)._M_manager != (_Manager_type)0x0) {
                dVar1 = (*loss->_M_invoker)((_Any_data *)loss,&local_60);
                return (double)(~-(ulong)(dVar1 < local_48) & (ulong)local_38 |
                               (ulong)local_28 & -(ulong)(dVar1 < local_48));
              }
            }
          }
        }
      }
    }
  }
LAB_00157767:
  std::__throw_bad_function_call();
}

Assistant:

double optimize(double initial, std::function<double(double)> loss)
{
	// determine search interval
	double f_initial = loss(initial);
	double l = initial-1, r = initial+1;
	double fl = loss(l), fr = loss(r);
	for (double d=1; fl <= f_initial; d*=2) {
		l -= d;
		fl = loss(l);
	}
	for (double d=1; fr <= f_initial; d*=2) {
		r += d;
		fr = loss(r);
	}
	// Golden-section search
	const double gr = (std::sqrt(5.0) - 1) / 2;
    double c = r - (r-l) * gr;
    double d = l + (r-l) * gr;
    double fc = loss(c);
    double fd = loss(d);
    while (std::abs(c - d) > 1e-5) {
        if (fc < fd)
        {
            r = d;
            d = c;
            fd = fc;
            c = l + (d-l) * gr;
            fc = loss(c);
        }
        else
        {
            l = c;
            c = d;
            fc = fd;
            d = r - (r-c) * gr;
            fd = loss(d);
        }
    }
    // check if we have really done at least some optimization
    if (loss((l+r)/2) > loss(initial))
    	return initial;
    return (l+r)/2;
}